

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O3

IterateResult __thiscall glcts::LayoutBindingBaseCase::iterate(LayoutBindingBaseCase *this)

{
  map<glcts::eStageType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<glcts::eStageType>,_std::allocator<std::pair<const_glcts::eStageType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  TestLog *this_01;
  int iVar1;
  mapped_type *pmVar2;
  code *pcVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *description;
  qpTestResult testResult;
  TestContext *this_02;
  pointer pLVar4;
  LayoutBindingTestResult result;
  byte local_21b;
  allocator<char> local_21a;
  allocator<char> local_219;
  string local_218;
  string local_1f8;
  string local_1d0;
  undefined1 local_1b0 [8];
  undefined1 local_1a8 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  _Alloc_hider local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180 [4];
  ios_base local_138 [264];
  
  this_01 = ((this->super_TestCase).m_context)->m_testCtx->m_log;
  iVar1 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x22])();
  if ((char)iVar1 == '\0') {
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"NotSupported","");
    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,0x1aee929);
    tcu::LogSection::LogSection((LogSection *)local_1b0,&local_1f8,&local_218);
    tcu::TestLog::startSection(this_01,(char *)local_1b0,local_190._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_p != local_180) {
      operator_delete(local_190._M_p,local_180[0]._M_allocated_capacity + 1);
    }
    if (local_1b0 != (undefined1  [8])(local_1a8 + 8)) {
      operator_delete((void *)local_1b0,local_1a0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    local_1b0 = (undefined1  [8])this_01;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"This test was not run as minimum requirements were not met.",
               0x3b);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    tcu::TestLog::endSection(this_01);
    iVar1 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x16])(this);
    this_02 = *(TestContext **)CONCAT44(extraout_var,iVar1);
    description = "NotSupported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  else {
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[2])(this);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x27])(this);
    pLVar4 = (this->m_tests).
             super__Vector_base<glcts::LayoutBindingBaseCase::LayoutBindingSubTest,_std::allocator<glcts::LayoutBindingBaseCase::LayoutBindingSubTest>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (pLVar4 == (this->m_tests).
                  super__Vector_base<glcts::LayoutBindingBaseCase::LayoutBindingSubTest,_std::allocator<glcts::LayoutBindingBaseCase::LayoutBindingSubTest>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      local_21b = 1;
    }
    else {
      this_00 = &this->m_sources;
      local_21b = 1;
      do {
        initDefaultVSContext_abi_cxx11_((String *)local_1b0,this);
        local_1f8._M_dataplus._M_p = local_1f8._M_dataplus._M_p & 0xffffffff00000000;
        pmVar2 = std::
                 map<glcts::eStageType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<glcts::eStageType>,_std::allocator<std::pair<const_glcts::eStageType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](this_00,(key_type *)&local_1f8);
        std::__cxx11::string::operator=((string *)pmVar2,(string *)local_1b0);
        if (local_1b0 != (undefined1  [8])(local_1a8 + 8)) {
          operator_delete((void *)local_1b0,local_1a0._M_allocated_capacity + 1);
        }
        initDefaultFSContext_abi_cxx11_((String *)local_1b0,this);
        local_1f8._M_dataplus._M_p._0_4_ = 1;
        pmVar2 = std::
                 map<glcts::eStageType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<glcts::eStageType>,_std::allocator<std::pair<const_glcts::eStageType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](this_00,(key_type *)&local_1f8);
        std::__cxx11::string::operator=((string *)pmVar2,(string *)local_1b0);
        if (local_1b0 != (undefined1  [8])(local_1a8 + 8)) {
          operator_delete((void *)local_1b0,local_1a0._M_allocated_capacity + 1);
        }
        initDefaultCSContext_abi_cxx11_((String *)local_1b0,this);
        local_1f8._M_dataplus._M_p._0_4_ = 2;
        pmVar2 = std::
                 map<glcts::eStageType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<glcts::eStageType>,_std::allocator<std::pair<const_glcts::eStageType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](this_00,(key_type *)&local_1f8);
        std::__cxx11::string::operator=((string *)pmVar2,(string *)local_1b0);
        if (local_1b0 != (undefined1  [8])(local_1a8 + 8)) {
          operator_delete((void *)local_1b0,local_1a0._M_allocated_capacity + 1);
        }
        pcVar3 = (code *)pLVar4->test;
        if (((ulong)pcVar3 & 1) != 0) {
          pcVar3 = *(code **)(pcVar3 + *(long *)((long)&(this->super_TestCase).super_TestCase.
                                                        super_TestNode._vptr_TestNode +
                                                *(long *)&pLVar4->field_0x18) + -1);
        }
        (*pcVar3)(&local_1f8);
        if ((byte)local_1f8._M_dataplus._M_p == '\0') {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_218,pLVar4->name,&local_219);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1d0,pLVar4->description,&local_21a);
          tcu::LogSection::LogSection((LogSection *)local_1b0,&local_218,&local_1d0);
          tcu::TestLog::startSection(this_01,(char *)local_1b0,local_190._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_190._M_p != local_180) {
            operator_delete(local_190._M_p,local_180[0]._M_allocated_capacity + 1);
          }
          if (local_1b0 != (undefined1  [8])(local_1a8 + 8)) {
            operator_delete((void *)local_1b0,local_1a0._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
            operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218._M_dataplus._M_p != &local_218.field_2) {
            operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
          }
          local_1b0 = (undefined1  [8])this_01;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_218,local_1f8._M_string_length,
                     (undefined1 *)
                     (local_1f8._M_string_length + local_1f8.field_2._M_allocated_capacity));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,local_218._M_dataplus._M_p,local_218._M_string_length);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218._M_dataplus._M_p != &local_218.field_2) {
            operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
          tcu::TestLog::endSection(this_01);
        }
        if (local_1f8._M_dataplus._M_p._1_1_ == '\x01') {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_218,pLVar4->name,&local_219);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1d0,pLVar4->description,&local_21a);
          tcu::LogSection::LogSection((LogSection *)local_1b0,&local_218,&local_1d0);
          tcu::TestLog::startSection(this_01,(char *)local_1b0,local_190._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_190._M_p != local_180) {
            operator_delete(local_190._M_p,local_180[0]._M_allocated_capacity + 1);
          }
          if (local_1b0 != (undefined1  [8])(local_1a8 + 8)) {
            operator_delete((void *)local_1b0,local_1a0._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
            operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218._M_dataplus._M_p != &local_218.field_2) {
            operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
          }
          local_1b0 = (undefined1  [8])this_01;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "This test was not run for this context as it does not apply.",0x3c);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
          tcu::TestLog::endSection(this_01);
        }
        local_21b = local_21b & (byte)local_1f8._M_dataplus._M_p;
        if ((undefined1 *)local_1f8._M_string_length != (undefined1 *)((long)&local_1f8.field_2 + 8)
           ) {
          operator_delete((void *)local_1f8._M_string_length,local_1f8.field_2._8_8_ + 1);
        }
        pLVar4 = pLVar4 + 1;
      } while (pLVar4 != (this->m_tests).
                         super__Vector_base<glcts::LayoutBindingBaseCase::LayoutBindingSubTest,_std::allocator<glcts::LayoutBindingBaseCase::LayoutBindingSubTest>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x28])(this);
    iVar1 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x16])(this);
    this_02 = *(TestContext **)CONCAT44(extraout_var_00,iVar1);
    testResult = (qpTestResult)(local_21b ^ 1);
    description = "Fail";
    if (local_21b != 0) {
      description = "Pass";
    }
  }
  tcu::TestContext::setTestResult(this_02,testResult,description);
  return STOP;
}

Assistant:

LayoutBindingBaseCase::IterateResult LayoutBindingBaseCase::iterate(void)
{
	tcu::TestLog& log	= m_context.getTestContext().getLog();
	bool		  passed = true;

	if (!isSupported())
	{
		log << tcu::TestLog::Section("NotSupported", "");
		log << tcu::TestLog::Message << "This test was not run as minimum requirements were not met."
			<< tcu::TestLog::EndMessage;
		log << tcu::TestLog::EndSection;
		getContext().getTestContext().setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "NotSupported");
		return STOP;
	}

	// init test case (create shader templates and textures)
	init();

	// allocate resources for all subtests
	setupTest();

	for (std::vector<LayoutBindingSubTest>::iterator it = m_tests.begin(); it != m_tests.end(); it++)
	{
		// need to reset templates and their args to a clean state before every
		// test to avoid bleeding.
		m_sources[VertexShader]   = initDefaultVSContext();
		m_sources[FragmentShader] = initDefaultFSContext();
		m_sources[ComputeShader]  = initDefaultCSContext();

		LayoutBindingTestResult result = ((*this).*((*it).test))();
		if (!result.testPassed())
		{
			log << tcu::TestLog::Section((*it).name, (*it).description);
			log << tcu::TestLog::Message << result.getReason() << tcu::TestLog::EndMessage;
			log << tcu::TestLog::EndSection;
		}
		if (!result.runForThisContext())
		{
			log << tcu::TestLog::Section((*it).name, (*it).description);
			log << tcu::TestLog::Message << "This test was not run for this context as it does not apply."
				<< tcu::TestLog::EndMessage;
			log << tcu::TestLog::EndSection;
		}
		passed &= result.testPassed();
	}

	// cleanup resources
	teardownTest();

	/*=========================================================================
	 TEST results
	 =========================================================================*/

	getContext().getTestContext().setTestResult(passed ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL,
												passed ? "Pass" : "Fail");

	return STOP;
}